

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_path_arc_to_fast
               (nk_draw_list *list,nk_vec2 center,float radius,int a_min,int a_max)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  nk_vec2 pos;
  float y;
  float x;
  nk_vec2 c;
  int a;
  int a_max_local;
  int a_min_local;
  float radius_local;
  nk_draw_list *list_local;
  nk_vec2 center_local;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2187,
                  "void nk_draw_list_path_arc_to_fast(struct nk_draw_list *, struct nk_vec2, float, int, int)"
                 );
  }
  if ((list != (nk_draw_list *)0x0) && (c.x = (float)a_min, a_min <= a_max)) {
    for (; (int)c.x <= a_max; c.x = (float)((int)c.x + 1)) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(int)c.x;
      uVar1 = *(undefined8 *)
               ((long)&list->circle_vtx[0].x +
               (ulong)(((int)c.x +
                       (SUB164(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) >> 1 & 0xfffffffc) * -3) * 8)
               );
      list_local._0_4_ = center.x;
      y = (float)uVar1;
      list_local._4_4_ = center.y;
      x = (float)((ulong)uVar1 >> 0x20);
      pos = nk_vec2(y * radius + list_local._0_4_,x * radius + list_local._4_4_);
      nk_draw_list_path_line_to(list,pos);
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_path_arc_to_fast(struct nk_draw_list *list, struct nk_vec2 center,
    float radius, int a_min, int a_max)
{
    int a = 0;
    NK_ASSERT(list);
    if (!list) return;
    if (a_min <= a_max) {
        for (a = a_min; a <= a_max; a++) {
            const struct nk_vec2 c = list->circle_vtx[(nk_size)a % NK_LEN(list->circle_vtx)];
            const float x = center.x + c.x * radius;
            const float y = center.y + c.y * radius;
            nk_draw_list_path_line_to(list, nk_vec2(x, y));
        }
    }
}